

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O1

int SUNMatCopy_Band(SUNMatrix A,SUNMatrix B)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  SUNMatrix_ID SVar7;
  void *pvVar8;
  void *pvVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  
  iVar6 = SMCompatible_Band(A,B);
  if (iVar6 == 0) {
    iVar6 = -0x2bd;
  }
  else {
    pvVar9 = A->content;
    iVar6 = *(int *)((long)pvVar9 + 0xc);
    pvVar8 = B->content;
    iVar1 = *(int *)((long)pvVar8 + 0xc);
    if ((iVar1 < iVar6) || (*(int *)((long)pvVar8 + 0x10) < *(int *)((long)pvVar9 + 0x10))) {
      iVar2 = *(int *)((long)pvVar9 + 0x10);
      if (*(int *)((long)pvVar9 + 0x10) < *(int *)((long)pvVar8 + 0x10)) {
        iVar2 = *(int *)((long)pvVar8 + 0x10);
      }
      if (iVar6 < iVar1) {
        iVar6 = iVar1;
      }
      iVar1 = *(int *)((long)pvVar9 + 0x14);
      if (*(int *)((long)pvVar9 + 0x14) < *(int *)((long)pvVar8 + 0x14)) {
        iVar1 = *(int *)((long)pvVar8 + 0x14);
      }
      iVar12 = iVar2 + 1 + iVar1;
      *(int *)((long)pvVar8 + 0xc) = iVar6;
      *(int *)((long)pvVar8 + 0x10) = iVar2;
      *(int *)((long)pvVar8 + 0x14) = iVar1;
      *(int *)((long)pvVar8 + 8) = iVar12;
      lVar11 = (long)*(int *)((long)pvVar8 + 4) * (long)iVar12;
      *(int *)((long)pvVar8 + 0x20) = (int)lVar11;
      pvVar8 = realloc(*(void **)((long)pvVar8 + 0x18),lVar11 * 8);
      pvVar9 = B->content;
      *(void **)((long)pvVar9 + 0x18) = pvVar8;
      if (0 < *(int *)((long)pvVar9 + 4)) {
        lVar11 = 0;
        lVar10 = 0;
        do {
          *(long *)(*(long *)((long)pvVar9 + 0x28) + lVar10 * 8) =
               *(long *)((long)pvVar9 + 0x18) + lVar11;
          lVar10 = lVar10 + 1;
          pvVar9 = B->content;
          lVar11 = lVar11 + (long)iVar12 * 8;
        } while (lVar10 < *(int *)((long)pvVar9 + 4));
      }
    }
    SVar7 = SUNMatGetID(B);
    iVar6 = -0x2bf;
    if (SVar7 == SUNMATRIX_BAND) {
      lVar11 = (long)*(int *)((long)B->content + 0x20);
      if (0 < lVar11) {
        memset(*(void **)((long)B->content + 0x18),0,lVar11 << 3);
      }
      pvVar9 = B->content;
      iVar6 = *(int *)((long)pvVar9 + 4);
      if (0 < (long)iVar6) {
        lVar11 = *(long *)((long)pvVar9 + 0x28);
        iVar1 = *(int *)((long)pvVar9 + 0x14);
        pvVar9 = A->content;
        lVar10 = *(long *)((long)pvVar9 + 0x28);
        iVar2 = *(int *)((long)pvVar9 + 0x14);
        iVar12 = *(int *)((long)pvVar9 + 0xc);
        iVar3 = *(int *)((long)pvVar9 + 0x10);
        lVar13 = 0;
        do {
          if (SBORROW4(iVar3,-iVar12) == iVar3 + iVar12 < 0) {
            lVar4 = *(long *)(lVar10 + lVar13 * 8);
            lVar5 = *(long *)(lVar11 + lVar13 * 8);
            lVar14 = 0;
            do {
              *(undefined8 *)(lVar5 + (long)iVar1 * 8 + (long)iVar12 * -8 + lVar14 * 8) =
                   *(undefined8 *)(lVar4 + (long)iVar2 * 8 + (long)iVar12 * -8 + lVar14 * 8);
              lVar14 = lVar14 + 1;
            } while (iVar3 + iVar12 + 1 != (int)lVar14);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != iVar6);
      }
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int SUNMatCopy_Band(SUNMatrix A, SUNMatrix B)
{
  sunindextype i, j, colSize, ml, mu, smu;
  realtype *A_colj, *B_colj;

  /* Verify that A and B have compatible dimensions */
  if (!SMCompatible_Band(A, B))
    return SUNMAT_ILL_INPUT;

  /* Grow B if A's bandwidth is larger */
  if ( (SM_UBAND_B(A) > SM_UBAND_B(B)) ||
       (SM_LBAND_B(A) > SM_LBAND_B(B)) ) {
    ml  = SUNMAX(SM_LBAND_B(B),SM_LBAND_B(A));
    mu  = SUNMAX(SM_UBAND_B(B),SM_UBAND_B(A));
    smu = SUNMAX(SM_SUBAND_B(B),SM_SUBAND_B(A));
    colSize = smu + ml + 1;
    SM_CONTENT_B(B)->mu = mu;
    SM_CONTENT_B(B)->ml = ml;
    SM_CONTENT_B(B)->s_mu = smu;
    SM_CONTENT_B(B)->ldim = colSize;
    SM_CONTENT_B(B)->ldata = SM_COLUMNS_B(B) * colSize;
    SM_CONTENT_B(B)->data = (realtype *)
      realloc(SM_CONTENT_B(B)->data, SM_COLUMNS_B(B) * colSize*sizeof(realtype));
    for (j=0; j<SM_COLUMNS_B(B); j++)
      SM_CONTENT_B(B)->cols[j] = SM_CONTENT_B(B)->data + j * colSize;
  }

  /* Perform operation */
  if (SUNMatZero_Band(B) != SUNMAT_SUCCESS)
    return SUNMAT_OPERATION_FAIL;
  for (j=0; j<SM_COLUMNS_B(B); j++) {
    B_colj = SM_COLUMN_B(B,j);
    A_colj = SM_COLUMN_B(A,j);
    for (i=-SM_UBAND_B(A); i<=SM_LBAND_B(A); i++)
      B_colj[i] = A_colj[i];
  }
  return SUNMAT_SUCCESS;
}